

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O2

void cmap_init_default(void)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    G_cmap_input[lVar1] = (uchar)lVar1;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    G_cmap_output[lVar1] = (uchar)lVar1;
  }
  G_cmap_id[4] = '\0';
  G_cmap_id[0] = '\0';
  G_cmap_id[1] = '\0';
  G_cmap_id[2] = '\0';
  G_cmap_id[3] = '\0';
  builtin_strncpy(G_cmap_ldesc,"(native/no mapping)",0x14);
  S_cmap_loaded = 0;
  return;
}

Assistant:

void cmap_init_default(void)
{
    size_t i;

    /* initialize the input table */
    for (i = 0 ; i < sizeof(G_cmap_input)/sizeof(G_cmap_input[0]) ; ++i)
        G_cmap_input[i] = (unsigned char)i;

    /* initialize the output table */
    for (i = 0 ; i < sizeof(G_cmap_output)/sizeof(G_cmap_output[0]) ; ++i)
        G_cmap_output[i] = (unsigned char)i;

    /* we have a null ID */
    memset(G_cmap_id, 0, sizeof(G_cmap_id));

    /* indicate that it's the default */
    strcpy(G_cmap_ldesc, "(native/no mapping)");

    /* note that we have no character set loaded */
    S_cmap_loaded = FALSE;
}